

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O3

ErrorStackOption *
ritobin::io::json_impl::json_value_impl<ritobin::I64,_(ritobin::Category)1>::from_json
          (ErrorStackOption *__return_storage_ptr__,I64 *value,json *json)

{
  bool bVar1;
  long ret;
  undefined8 local_28;
  undefined7 uStack_20;
  
  bVar1 = 2 < (byte)(json->m_type - number_integer);
  if (bVar1) {
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type =
         "i64";
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.message =
         "json.is_number()";
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
    _M_dataplus._M_p =
         (pointer)((long)&(__return_storage_ptr__->
                          super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                          _M_payload.
                          super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                          .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                          _M_payload + 0x20);
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
             super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
             super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x20) = 0
    ;
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                      _M_payload.
                      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                      .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                      _M_value.path.field_2 + 1) = CONCAT17(local_28._7_1_,(undefined7)local_28);
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                      _M_payload.
                      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                      .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                      _M_value.path.field_2 + 8) = CONCAT71(uStack_20,local_28._7_1_);
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
    _M_string_length = 0;
  }
  else {
    nlohmann::detail::
    get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long,_0>
              (json,&local_28);
    value->value = CONCAT17(local_28._7_1_,(undefined7)local_28);
  }
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = bVar1;
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            using value_t = std::remove_cvref_t<decltype(value.value)>;
            if constexpr (std::is_same_v<value_t, bool>) {
                bin_json_assert(json.is_boolean());
            } else {
                bin_json_assert(json.is_number());
            }
            value.value = json;
            return std::nullopt;
        }